

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O1

void fe::operations::
     applyOperationT<fe::operations::op_blend_one_invSrcAlpha,fe::PixelA8,fe::PixelR8G8B8A8>
               (op_blend_one_invSrcAlpha *op,PixelA8 *srcPixelFormat,PixelR8G8B8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  bVar5 = check(src,dest);
  if ((bVar5) && (iVar2 = (dest->super_fe_image).h, iVar2 != 0)) {
    iVar3 = (dest->super_fe_image).w;
    pbVar10 = (dest->super_fe_image).data;
    pbVar11 = (src->super_fe_image).data;
    iVar9 = 0;
    iVar4 = iVar3;
    pbVar8 = pbVar11;
    pbVar7 = pbVar10;
    do {
      for (; iVar4 != 0; iVar4 = iVar4 + -1) {
        bVar1 = *pbVar11;
        bVar12 = ~bVar1;
        uVar13 = ((uint)*pbVar10 * (uint)bVar12) / 0xff + (uint)bVar1;
        if (0xfe < uVar13) {
          uVar13 = 0xff;
        }
        uVar15 = (uint)bVar1;
        uVar14 = ((uint)pbVar10[1] * (uint)bVar12) / 0xff + uVar15;
        if (0xfe < uVar14) {
          uVar14 = 0xff;
        }
        uVar6 = ((uint)pbVar10[2] * (uint)bVar12) / 0xff + uVar15;
        if (0xfe < uVar6) {
          uVar6 = 0xff;
        }
        uVar15 = ((uint)pbVar10[3] * (uint)bVar12) / 0xff + uVar15;
        if (0xfe < uVar15) {
          uVar15 = 0xff;
        }
        *pbVar10 = (byte)uVar13;
        pbVar10[1] = (byte)uVar14;
        pbVar10[2] = (byte)uVar6;
        pbVar10[3] = (byte)uVar15;
        pbVar10 = pbVar10 + (dest->super_fe_image).bytespp;
        pbVar11 = pbVar11 + (src->super_fe_image).bytespp;
      }
      pbVar11 = pbVar8 + (src->super_fe_image).pitch;
      pbVar10 = pbVar7 + (dest->super_fe_image).pitch;
      iVar9 = iVar9 + 1;
      iVar4 = iVar3;
      pbVar8 = pbVar11;
      pbVar7 = pbVar10;
    } while (iVar9 != iVar2);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }